

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

TestFunc sglr::rr_util::mapGLTestFunc(deUint32 func)

{
  TestFunc local_c;
  deUint32 func_local;
  
  switch(func) {
  case 0x200:
    local_c = TESTFUNC_NEVER;
    break;
  case 0x201:
    local_c = TESTFUNC_LESS;
    break;
  case 0x202:
    local_c = TESTFUNC_EQUAL;
    break;
  case 0x203:
    local_c = TESTFUNC_LEQUAL;
    break;
  case 0x204:
    local_c = TESTFUNC_GREATER;
    break;
  case 0x205:
    local_c = TESTFUNC_NOTEQUAL;
    break;
  case 0x206:
    local_c = TESTFUNC_GEQUAL;
    break;
  case 0x207:
    local_c = TESTFUNC_ALWAYS;
    break;
  default:
    local_c = TESTFUNC_LAST;
  }
  return local_c;
}

Assistant:

rr::TestFunc mapGLTestFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ALWAYS:		return rr::TESTFUNC_ALWAYS;
		case GL_EQUAL:		return rr::TESTFUNC_EQUAL;
		case GL_GEQUAL:		return rr::TESTFUNC_GEQUAL;
		case GL_GREATER:	return rr::TESTFUNC_GREATER;
		case GL_LEQUAL:		return rr::TESTFUNC_LEQUAL;
		case GL_LESS:		return rr::TESTFUNC_LESS;
		case GL_NEVER:		return rr::TESTFUNC_NEVER;
		case GL_NOTEQUAL:	return rr::TESTFUNC_NOTEQUAL;
		default:
			DE_ASSERT(false);
			return rr::TESTFUNC_LAST;
	}
}